

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

bool __thiscall
spirv_cross::CompilerGLSL::is_non_native_row_major_matrix(CompilerGLSL *this,uint32_t id)

{
  bool bVar1;
  ID local_2c;
  SPIRExpression *local_28;
  SPIRExpression *e;
  CompilerGLSL *pCStack_18;
  uint32_t id_local;
  CompilerGLSL *this_local;
  
  e._4_4_ = id;
  pCStack_18 = this;
  if ((((this->backend).native_row_major_matrix & 1U) != 0) && (bVar1 = is_legacy(this), !bVar1)) {
    return false;
  }
  local_28 = Compiler::maybe_get<spirv_cross::SPIRExpression>(&this->super_Compiler,e._4_4_);
  if (local_28 == (SPIRExpression *)0x0) {
    TypedID<(spirv_cross::Types)0>::TypedID(&local_2c,e._4_4_);
    this_local._7_1_ = Compiler::has_decoration(&this->super_Compiler,local_2c,DecorationRowMajor);
  }
  else {
    this_local._7_1_ = (bool)(local_28->need_transpose & 1);
  }
  return this_local._7_1_;
}

Assistant:

bool CompilerGLSL::is_non_native_row_major_matrix(uint32_t id)
{
	// Natively supported row-major matrices do not need to be converted.
	// Legacy targets do not support row major.
	if (backend.native_row_major_matrix && !is_legacy())
		return false;

	auto *e = maybe_get<SPIRExpression>(id);
	if (e)
		return e->need_transpose;
	else
		return has_decoration(id, DecorationRowMajor);
}